

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImDrawList *this;
  ImVec2 IVar2;
  uint *puVar3;
  ImDrawVert *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImU32 IVar7;
  undefined1 __src [8];
  ImVec2 *out_r;
  uint uVar8;
  ImU32 col_upr_right;
  ImU32 IVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  undefined7 extraout_var;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  char cVar13;
  ImVec2 *pIVar14;
  uint uVar15;
  ImGuiContext *g;
  byte bVar16;
  undefined7 uVar17;
  bool bVar18;
  uint uVar19;
  float fVar20;
  int iVar21;
  undefined4 extraout_XMM0_Db_01;
  int iVar24;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 IVar22;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  int iVar25;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 auVar23 [16];
  undefined4 extraout_XMM0_Dd_01;
  int iVar26;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined8 extraout_XMM0_Qb;
  float fVar27;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float V;
  ImVec2 picker_pos;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  float ww;
  ImVec2 tra;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_230;
  float local_22c;
  float local_228;
  uint local_224;
  ImGuiContext *local_220;
  uint local_214;
  uint local_210;
  float local_20c;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  ImVec2 local_1f8;
  ImU32 local_1ec;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  ImVec2 local_1c8;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  ImVec2 *local_1b0;
  ImU32 local_1a4;
  ImU32 local_1a0;
  uint local_19c;
  ImVec2 local_198;
  ImVec2 local_190;
  float local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  ImVec2 local_170;
  ImVec2 local_168;
  float fStack_160;
  float fStack_15c;
  int local_158;
  int local_154;
  uint local_150;
  float local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [8];
  ImVec2 local_130;
  undefined1 local_128 [16];
  ImGuiWindow *local_118;
  ImVec2 local_110;
  float local_108;
  ImVec2 local_f8;
  ImU32 local_ec;
  ImVec4 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  uStack_1e0 = local_1e8;
  local_1e8 = (undefined1  [8])ref_col;
  local_118 = GImGui->CurrentWindow;
  local_118->WriteAccessed = true;
  if (local_118->SkipItems != false) {
    bVar16 = 0;
    goto LAB_0016b507;
  }
  this = local_118->DrawList;
  local_208._0_4_ = CalcItemWidth();
  local_208._4_4_ = extraout_XMM0_Db;
  uStack_200._0_4_ = extraout_XMM0_Dc;
  uStack_200._4_4_ = extraout_XMM0_Dd;
  local_220 = pIVar5;
  (pIVar5->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar15 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar15);
  }
  pIVar5 = local_220;
  if ((flags & 0x6000000U) == 0) {
    uVar8 = local_220->ColorEditOptions & 0x6000000;
    uVar19 = 0x2000000;
    if (uVar8 != 0) {
      uVar19 = uVar8;
    }
    uVar15 = uVar15 | uVar19;
  }
  if ((uVar15 & 0x18000000) == 0) {
    uVar8 = local_220->ColorEditOptions & 0x18000000;
    uVar19 = 0x8000000;
    if (uVar8 != 0) {
      uVar19 = uVar8;
    }
    uVar15 = uVar15 | uVar19;
  }
  uVar19 = (uVar15 & 0x6000000) - 1;
  if ((uVar15 & 0x6000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1206,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar19 = (uVar15 & 0x18000000) - 1;
  if ((uVar15 & 0x18000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1207,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar15 & 8) == 0) {
    uVar15 = uVar15 | local_220->ColorEditOptions & 0x10000U;
  }
  local_19c = uVar15 & 0x10002;
  uVar11 = (ulong)local_19c;
  bVar18 = local_19c == 0x10000;
  local_1f8 = (local_118->DC).CursorPos;
  local_1b0 = (ImVec2 *)col;
  local_148 = GetFrameHeight();
  pIVar14 = local_1b0;
  fVar31 = (pIVar5->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar31);
  fVar31 = (float)local_208._0_4_ - (local_148 + fVar31) * (float)(byte)(bVar18 + 1);
  uVar19 = -(uint)(fVar31 <= local_148);
  uStack_184 = local_208._4_4_ & extraout_XMM0_Db_00;
  uStack_180 = (uint)uStack_200 & extraout_XMM0_Dc_00;
  uStack_17c = uStack_200._4_4_ & extraout_XMM0_Dd_00;
  local_188 = (float)(uVar19 & (uint)local_148 | ~uVar19 & (uint)fVar31);
  local_b8 = (ulong)((uVar15 & 2) == 0) * 4 + 0xc;
  uStack_144 = extraout_XMM0_Db_00;
  uStack_140 = extraout_XMM0_Dc_00;
  uStack_13c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_1b0,local_b8);
  local_20c = local_188 * 0.08;
  local_a8 = ZEXT416((uint)(local_188 * 0.5));
  local_190.x = local_188 * 0.5 - local_20c;
  _local_c8 = ZEXT416((uint)local_190.x);
  local_1c8.x = (local_148 + local_188) * 0.5 + local_1f8.x;
  local_1c8.y = local_188 * 0.5 + local_1f8.y;
  local_208._4_4_ = local_1f8.y;
  local_208._0_4_ = local_1f8.x + local_188 + (float)local_128._0_4_;
  uStack_200 = 0;
  local_190.x = local_190.x - (float)(int)(local_188 * 0.027);
  local_170.x = local_190.x * -0.5;
  local_170.y = local_190.x * -0.866025;
  local_190.y = 0.0;
  local_198.y = local_190.x * 0.866025;
  local_230 = pIVar14->x;
  local_22c = pIVar14->y;
  local_228 = pIVar14[1].x;
  local_1bc = local_228;
  local_1b8 = local_22c;
  local_1b4 = local_230;
  local_198.x = local_170.x;
  if ((uVar15 >> 0x1b & 1) == 0) {
    if ((uVar15 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_230,local_22c,local_228,&local_1b4,&local_1b8,&local_1bc);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_230,local_22c,local_228,&local_230,&local_22c,&local_228);
    uVar11 = (ulong)((uint)pIVar5->ColorEditLastColor[2] ^ (uint)pIVar14[1].x) |
             *(ulong *)pIVar5->ColorEditLastColor ^ (ulong)*pIVar14;
    if (uVar11 == 0) {
      if ((local_22c == 0.0) && (!NAN(local_22c))) {
        local_230 = local_220->ColorEditLastHue;
      }
      if ((local_228 == 0.0) && (!NAN(local_228))) {
        local_22c = local_220->ColorEditLastSat;
      }
    }
  }
  uVar10 = (undefined4)uVar11;
  local_1d8._4_4_ = uStack_144;
  local_1d8._0_4_ = local_148 + (float)local_208._0_4_;
  fStack_1d0 = (float)uStack_140;
  fStack_1cc = (float)uStack_13c;
  PushItemFlag(8,true);
  pIVar6 = local_220;
  uVar17 = (undefined7)((ulong)pIVar5 >> 8);
  if ((uVar15 >> 0x1a & 1) == 0) {
    if ((uVar15 >> 0x19 & 1) == 0) {
      local_210 = 0;
      local_214 = 0;
      uVar11 = 0;
    }
    else {
      local_168.y = local_188;
      local_168.x = local_188;
      InvisibleButton("sv",&local_168);
      bVar18 = IsItemActive();
      if (bVar18) {
        auVar23._0_4_ = local_188 + -1.0;
        IVar22 = (local_220->IO).MousePos;
        auVar36._0_4_ = IVar22.x - local_1f8.x;
        auVar36._4_4_ = IVar22.y - local_1f8.y;
        auVar36._8_8_ = 0;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar23 = divps(auVar36,auVar23);
        fVar31 = auVar23._0_4_;
        fVar20 = auVar23._4_4_;
        auVar35._4_4_ = -(uint)(fVar31 < 0.0);
        auVar35._0_4_ = -(uint)(fVar20 < 0.0);
        auVar35._8_4_ = -(uint)(fVar20 < 1.0);
        auVar35._12_4_ = -(uint)(fVar31 < 1.0);
        uVar19 = movmskps((int)local_220,auVar35);
        auVar32._4_4_ = -(uint)(0.0 < fVar31);
        auVar32._0_4_ = -(uint)(0.0 < fVar20);
        auVar32._8_4_ = -(uint)(1.0 < fVar20);
        auVar32._12_4_ = -(uint)(1.0 < fVar31);
        uVar8 = movmskps(uVar10,auVar32);
        auVar36 = ZEXT816(0x3f800000);
        if ((uVar8 & 8) == 0) {
          auVar36 = auVar23;
        }
        fVar31 = 0.0;
        local_22c = 0.0;
        if ((uVar19 & 2) == 0) {
          local_22c = auVar36._0_4_;
        }
        if ((uVar8 & 4) == 0) {
          fVar31 = 1.0 - fVar20;
        }
        local_228 = 1.0;
        if ((uVar19 & 1) == 0) {
          local_228 = fVar31;
        }
        local_210 = (uint)CONCAT71((uint7)(uint3)(uVar19 >> 8),1);
      }
      else {
        local_210 = 0;
      }
      if ((uVar15 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_168.y = local_1f8.y;
      local_168.x = (float)local_208._0_4_;
      SetCursorScreenPos(&local_168);
      local_168.y = local_188;
      local_168.x = local_148;
      InvisibleButton("hue",&local_168);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar31 = ((local_220->IO).MousePos.y - local_1f8.y) / (local_188 + -1.0);
        local_230 = 1.0;
        if (fVar31 <= 1.0) {
          local_230 = fVar31;
        }
        local_230 = (float)(~-(uint)(fVar31 < 0.0) & (uint)local_230);
        local_214 = (uint)CONCAT71((int7)((ulong)local_220 >> 8),1);
        uVar11 = CONCAT71(uVar17,1);
      }
      else {
        local_214 = 0;
        uVar11 = (ulong)local_210;
      }
    }
  }
  else {
    local_168.y = local_188;
    local_168.x = (local_220->Style).ItemInnerSpacing.x + local_188 + local_148;
    InvisibleButton("hsv",&local_168);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar27 = (pIVar6->IO).MouseClickedPos[0].x - local_1c8.x;
      fVar37 = (pIVar6->IO).MouseClickedPos[0].y - local_1c8.y;
      fVar20 = (pIVar6->IO).MousePos.x - local_1c8.x;
      local_98 = ZEXT416((uint)fVar20);
      fVar31 = (pIVar6->IO).MousePos.y - local_1c8.y;
      local_88 = ZEXT416((uint)fVar31);
      local_78 = ZEXT416((uint)fVar37);
      local_d8 = ZEXT416((uint)fVar27);
      fVar27 = fVar27 * fVar27 + fVar37 * fVar37;
      if ((fVar27 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_a8._0_4_ + 1.0) * ((float)local_a8._0_4_ + 1.0) < fVar27)) {
        local_214 = 0;
      }
      else {
        fVar31 = atan2f(fVar31,fVar20);
        fVar31 = (fVar31 / 3.1415927) * 0.5;
        local_230 = (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar31 |
                           (uint)(fVar31 + 1.0) & -(uint)(fVar31 < 0.0));
        local_214 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_108 = cosf(local_230 * -2.0 * 3.1415927);
      fVar31 = sinf(local_230 * -2.0 * 3.1415927);
      uVar10 = local_d8._0_4_;
      local_d8._4_4_ = extraout_XMM0_Db_01;
      local_d8._0_4_ = fVar31;
      local_d8._8_4_ = extraout_XMM0_Dc_01;
      local_d8._12_4_ = extraout_XMM0_Dd_01;
      local_168.x = local_108 * (float)uVar10 + -(float)local_78._0_4_ * fVar31;
      local_168.y = fVar31 * (float)uVar10 + local_108 * (float)local_78._0_4_;
      bVar18 = ImTriangleContainsPoint(&local_190,&local_170,&local_198,&local_168);
      if (bVar18) {
        local_168.x = local_108 * (float)local_98._0_4_ +
                      -(float)local_88._0_4_ * (float)local_d8._0_4_;
        local_168.y = (float)local_d8._0_4_ * (float)local_98._0_4_ +
                      local_108 * (float)local_88._0_4_;
        bVar18 = ImTriangleContainsPoint(&local_190,&local_170,&local_198,&local_168);
        if (!bVar18) {
          local_168 = ImTriangleClosestPoint(&local_190,&local_170,&local_198,&local_168);
        }
        ImTriangleBarycentricCoords
                  (&local_190,&local_170,&local_198,&local_168,&local_e8.x,(float *)local_138,
                   &local_110.x);
        fVar20 = 1.0 - (float)local_138._0_4_;
        fVar31 = 1.0;
        if (fVar20 <= 1.0) {
          fVar31 = fVar20;
        }
        local_228 = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar20 < 0.0001) & (uint)fVar31);
        fVar20 = local_e8.x / local_228;
        fVar31 = 1.0;
        if (fVar20 <= 1.0) {
          fVar31 = fVar20;
        }
        local_22c = (float)(-(uint)(fVar20 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar20 < 0.0001) & (uint)fVar31);
        local_210 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar11 = CONCAT71(uVar17,1);
        pIVar14 = local_1b0;
      }
      else {
        local_210 = 0;
        uVar11 = (ulong)local_214;
      }
    }
    else {
      local_210 = 0;
      local_214 = 0;
      uVar11 = 0;
    }
    if ((uVar15 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_1d8._0_4_;
  if (local_19c == 0x10000) {
    local_168.y = local_1f8.y;
    local_168.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_168);
    local_168.y = local_188;
    local_168.x = local_148;
    InvisibleButton("alpha",&local_168);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar20 = ((local_220->IO).MousePos.y - local_1f8.y) / (local_188 + -1.0);
      fVar31 = 1.0;
      if (fVar20 <= 1.0) {
        fVar31 = fVar20;
      }
      pIVar14[1].y = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar31));
      uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    }
  }
  uVar19 = (uint)uVar11;
  PopItemFlag();
  if ((uVar15 >> 8 & 1) == 0) {
    SameLine(0.0,(local_220->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar15) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar15 >> 8 & 1) != 0) {
      SameLine(0.0,(local_220->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  local_224 = uVar19;
  if ((uVar15 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_168 = *pIVar14;
    fStack_160 = pIVar14[1].x;
    if ((uVar15 & 2) == 0) {
      fStack_15c = pIVar14[1].y;
    }
    else {
      fStack_15c = 1.0;
    }
    __src = local_1e8;
    if ((char)uVar15 < '\0') {
      Text("Current");
    }
    IVar22.x = local_148 * 3.0;
    IVar22.y = local_148 * 2.0;
    uStack_1e0._0_4_ = local_148 * 0.0;
    local_1e8._0_4_ = IVar22.x;
    local_1e8._4_4_ = IVar22.y;
    uStack_1e0._4_4_ = local_148 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_168,uVar15 & 0x180e0040,IVar22);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      local_e8._0_8_ = *(undefined8 *)__src;
      local_e8.z = *(float *)((long)__src + 8);
      if ((uVar15 & 2) == 0) {
        local_e8.w = *(float *)((long)__src + 0xc);
      }
      else {
        local_e8.w = 1.0;
      }
      bVar18 = ColorButton("##original",&local_e8,uVar15 & 0x180e0040,(ImVec2)local_1e8);
      if (bVar18) {
        memcpy(pIVar14,(void *)__src,local_b8);
        uVar19 = (uint)CONCAT71((int7)(uVar11 >> 8),1);
      }
    }
    local_224 = uVar19;
    PopItemFlag();
    EndGroup();
  }
  if (((char)local_214 != '\0') || ((char)local_210 != '\0')) {
    if ((uVar15 >> 0x1b & 1) == 0) {
      if ((uVar15 >> 0x1c & 1) != 0) {
        pIVar14->x = local_230;
        pIVar14->y = local_22c;
        pIVar14[1].x = local_228;
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_230) & (uint)local_230 |
                        (uint)(local_230 + -1e-05) & -(uint)(1.0 <= local_230)),
                 (float)(~-(uint)(0.0 < local_22c) & 0x3727c5ac |
                        (uint)local_22c & -(uint)(0.0 < local_22c)),
                 (float)(~-(uint)(0.0 < local_228) & 0x358637bd |
                        (uint)local_228 & -(uint)(0.0 < local_228)),&pIVar14->x,&pIVar14->y,
                 &pIVar14[1].x);
      local_220->ColorEditLastHue = local_230;
      local_220->ColorEditLastSat = local_22c;
      fVar31 = pIVar14->y;
      local_220->ColorEditLastColor[0] = pIVar14->x;
      local_220->ColorEditLastColor[1] = fVar31;
      local_220->ColorEditLastColor[2] = pIVar14[1].x;
    }
  }
  cVar13 = '\x01';
  fVar31 = local_148 * 0.2;
  fVar20 = 0.0;
  fVar27 = 0.0;
  fVar37 = 0.0;
  if ((uVar15 & 0x20) == 0) {
    _local_1e8 = ZEXT416((uint)(local_148 * 0.2));
    fVar31 = (float)local_128._0_4_;
    if (local_19c != 0x10000) {
      fVar31 = (float)local_208._0_4_;
    }
    PushItemWidth((fVar31 + local_148) - local_1f8.x);
    uVar19 = uVar15 & 0x198e001a;
    cVar13 = '\x01';
    if (((uVar15 >> 0x14 & 1) != 0 || (uVar15 & 0x600000) == 0) &&
       (bVar18 = ColorEdit4("##rgb",&local_1b0->x,uVar19 | 0x100004), bVar18)) {
      local_224 = (uint)CONCAT71(extraout_var,1);
      if (local_220->ActiveId == 0) {
        cVar13 = '\x01';
      }
      else {
        cVar13 = local_220->ActiveIdAllowOverlap;
      }
    }
    if ((uVar15 >> 0x15 & 1) != 0 || (uVar15 & 0x500000) == 0) {
      bVar18 = ColorEdit4("##hsv",&local_1b0->x,uVar19 | 0x200004);
      local_224 = CONCAT31((int3)(local_224 >> 8),(byte)local_224 | bVar18);
    }
    if ((uVar15 >> 0x16 & 1) != 0 || (uVar15 & 0x300000) == 0) {
      bVar18 = ColorEdit4("##hex",&local_1b0->x,uVar19 | 0x400004);
      local_224 = CONCAT31((int3)(local_224 >> 8),(byte)local_224 | bVar18);
    }
    PopItemWidth();
    fVar31 = (float)local_1e8._0_4_;
    fVar20 = (float)local_1e8._4_4_;
    fVar27 = (float)uStack_1e0;
    fVar37 = uStack_1e0._4_4_;
  }
  out_r = local_1b0;
  iVar21 = (int)fVar31;
  iVar24 = (int)fVar20;
  iVar25 = (int)fVar27;
  iVar26 = (int)fVar37;
  if (((uVar15 >> 0x1b & 1) != 0) && (cVar13 == '\0')) {
    local_1e8._4_4_ = iVar24;
    local_1e8._0_4_ = iVar21;
    uStack_1e0._0_4_ = (float)iVar25;
    uStack_1e0._4_4_ = (float)iVar26;
    ColorConvertRGBtoHSV
              (local_1b0->x,local_1b0->y,local_1b0[1].x,&local_168.x,&local_e8.x,(float *)local_138)
    ;
    if ((local_168.x <= 0.0) && (0.0 < local_230)) {
      if (0.0 < (float)local_138._0_4_) {
LAB_0016a7c1:
        if (0.0 < local_e8.x) goto LAB_0016a7e7;
        fVar31 = local_22c * 0.5;
      }
      else {
        if ((local_228 == (float)local_138._0_4_) &&
           (!NAN(local_228) && !NAN((float)local_138._0_4_))) goto LAB_0016a7c1;
        local_138._0_4_ = local_228 * 0.5;
        fVar31 = local_22c;
      }
      ColorConvertHSVtoRGB
                (local_230,fVar31,(float)local_138._0_4_,&out_r->x,&pIVar14->y,&pIVar14[1].x);
    }
LAB_0016a7e7:
    iVar21 = local_1e8._0_4_;
    iVar24 = local_1e8._4_4_;
    iVar25 = (int)(float)uStack_1e0;
    iVar26 = (int)uStack_1e0._4_4_;
  }
  pIVar14 = local_1b0;
  uVar19 = local_224;
  local_68 = (float)iVar21;
  fStack_64 = (float)iVar24;
  fStack_60 = (float)iVar25;
  fStack_5c = (float)iVar26;
  if ((char)local_224 != '\0') {
    if ((uVar15 >> 0x1b & 1) == 0) {
      if ((uVar15 >> 0x1c & 1) != 0) {
        local_230 = local_1b0->x;
        local_22c = local_1b0->y;
        local_228 = local_1b0[1].x;
        ColorConvertHSVtoRGB(local_230,local_22c,local_228,&local_1b4,&local_1b8,&local_1bc);
      }
    }
    else {
      local_1b4 = local_1b0->x;
      local_1b8 = local_1b0->y;
      local_1bc = local_1b0[1].x;
      ColorConvertRGBtoHSV(local_1b4,local_1b8,local_1bc,&local_230,&local_22c,&local_228);
      IVar2.x = local_220->ColorEditLastColor[0];
      IVar2.y = local_220->ColorEditLastColor[1];
      if (local_220->ColorEditLastColor[2] == pIVar14[1].x && IVar2 == *pIVar14) {
        if ((local_22c == 0.0) && (!NAN(local_22c))) {
          local_230 = local_220->ColorEditLastHue;
        }
        if ((local_228 == 0.0) && (!NAN(local_228))) {
          local_22c = local_220->ColorEditLastSat;
        }
      }
    }
  }
  pIVar5 = local_220;
  local_e8.w = (local_220->Style).Alpha;
  fVar31 = 1.0;
  if (local_e8.w <= 1.0) {
    fVar31 = local_e8.w;
  }
  iVar21 = (int)((float)(~-(uint)(local_e8.w < 0.0) & (uint)fVar31) * 255.0 + 0.5);
  local_e8.x = 1.0;
  local_e8.y = 1.0;
  local_e8.z = 1.0;
  uVar8 = iVar21 * 0x1000000;
  local_b0 = (ulong)uVar8;
  local_158 = uVar8 + 0xff0000;
  local_150 = iVar21 << 0x18 | 0xff;
  fStack_160 = (float)(iVar21 << 0x18 | 0xff00);
  fStack_15c = (float)(iVar21 << 0x18 | 0xffff00);
  local_1ec = uVar8 + 0xffffff;
  local_168 = (ImVec2)(CONCAT44(iVar21 << 0x18,iVar21 << 0x18) | 0xffff000000ff);
  local_154 = uVar8 + 0xff00ff;
  local_1a0 = uVar8 + 0x808080;
  ColorConvertHSVtoRGB(local_230,1.0,1.0,&local_e8.x,&local_e8.y,&local_e8.z);
  col_upr_right = ColorConvertFloat4ToU32(&local_e8);
  local_138._4_4_ = local_1b8;
  local_138._0_4_ = local_1b4;
  local_130.y = (pIVar5->Style).Alpha;
  local_130.x = local_1bc;
  IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_138);
  IVar7 = local_1ec;
  local_110.x = 0.0;
  local_110.y = 0.0;
  if ((uVar15 >> 0x1a & 1) == 0) {
    if ((uVar15 >> 0x19 & 1) != 0) {
      local_1e8._4_4_ = local_188;
      local_1e8._0_4_ = local_188;
      uStack_1e0._0_4_ = local_188;
      uStack_1e0._4_4_ = local_188;
      local_138._0_4_ = local_1f8.x + local_188;
      local_138._4_4_ = local_1f8.y + local_188;
      local_1a4 = IVar9;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_1f8,(ImVec2 *)local_138,local_1ec,col_upr_right,col_upr_right,local_1ec
                );
      local_138._0_4_ = local_1f8.x + (float)local_1e8._0_4_;
      local_138._4_4_ = local_1f8.y + (float)local_1e8._4_4_;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_1f8,(ImVec2 *)local_138,0,0,(ImU32)local_b0,(ImU32)local_b0);
      p_max.x = (float)local_1e8._0_4_ + local_1f8.x;
      p_max.y = (float)local_1e8._4_4_ + local_1f8.y;
      RenderFrameBorder(local_1f8,p_max,0.0);
      auVar33._4_4_ = 1.0 - local_228;
      auVar33._0_4_ = local_22c;
      auVar33._8_8_ = 0;
      auVar36 = minps(_DAT_0017ea80,auVar33);
      fVar31 = local_1f8.x;
      fVar20 = local_1f8.y;
      auVar28._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_22c) & auVar36._0_4_) * (float)local_1e8._0_4_
                        + fVar31 + 0.5);
      auVar28._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_228) & auVar36._4_4_) *
                        (float)local_1e8._4_4_ + fVar20 + 0.5);
      auVar28._8_4_ = (float)(int)(auVar36._8_4_ * (float)uStack_1e0 + 0.0 + 0.0);
      auVar28._12_4_ = (float)(int)(auVar36._12_4_ * uStack_1e0._4_4_ + 0.0 + 0.0);
      auVar34._0_4_ = (float)local_1e8._0_4_ + fVar31 + -2.0;
      auVar34._4_4_ = (float)local_1e8._4_4_ + fVar20 + -2.0;
      auVar34._8_4_ = (float)uStack_1e0 + 0.0 + 0.0;
      auVar34._12_4_ = uStack_1e0._4_4_ + 0.0 + 0.0;
      auVar36 = minps(auVar34,auVar28);
      uVar15 = -(uint)(auVar28._0_4_ < fVar31 + 2.0);
      uVar19 = -(uint)(auVar28._4_4_ < fVar20 + 2.0);
      local_110 = (ImVec2)(CONCAT44(~uVar19 & auVar36._4_4_,~uVar15 & auVar36._0_4_) |
                          CONCAT44((uint)(fVar20 + 2.0) & uVar19,(uint)(fVar31 + 2.0) & uVar15));
      local_1e8._4_4_ = uStack_184;
      local_1e8._0_4_ = local_188 / 6.0;
      uStack_1e0._0_4_ = (float)uStack_180;
      uStack_1e0._4_4_ = (float)uStack_17c;
      lVar12 = 0;
      do {
        lVar1 = lVar12 + 1;
        local_138._4_4_ = (float)(int)lVar12 * (float)local_1e8._0_4_ + local_1f8.y;
        local_138._0_4_ = local_208._0_4_;
        local_f8.y = (float)(int)lVar1 * (float)local_1e8._0_4_ + local_1f8.y;
        local_f8.x = (float)local_1d8._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_138,&local_f8,(ImU32)(&local_168.x)[lVar12],
                   (ImU32)(&local_168.x)[lVar12],(ImU32)(&local_168.y)[lVar12],
                   (ImU32)(&local_168.y)[lVar12]);
        lVar12 = lVar1;
      } while (lVar1 != 6);
      _local_1e8 = ZEXT416((uint)(float)(int)(local_230 * local_188 + local_1f8.y + 0.5));
      p_min.y = local_1f8.y;
      p_min.x = (float)local_208._0_4_;
      p_max_00.y = local_188 + local_1f8.y;
      p_max_00.x = (float)local_1d8._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_208._0_4_ + -1.0;
      pos.y = (float)local_1e8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_148 + 2.0,(local_220->Style).Alpha);
      uVar19 = local_224;
      IVar9 = local_1a4;
    }
  }
  else {
    local_78 = ZEXT416((uint)(0.5 / (float)local_a8._0_4_));
    iVar21 = 4;
    if (4 < (int)(float)local_a8._0_4_ / 0xc) {
      iVar21 = (int)(float)local_a8._0_4_ / 0xc;
    }
    local_88._0_4_ = iVar21;
    local_98._4_4_ = 0x80000000;
    local_98._0_4_ = -(0.5 / (float)local_a8._0_4_);
    local_98._8_4_ = 0x80000000;
    local_98._12_4_ = 0x80000000;
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)local_c8._0_4_;
    local_d8._0_4_ = (float)local_a8._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar12 = 0;
    local_1a4 = IVar9;
    local_ec = col_upr_right;
    do {
      fVar31 = (float)(int)lVar12 / 6.0;
      local_108 = (fVar31 + fVar31) * 3.1415927 + (float)local_98._0_4_;
      fVar31 = ((float)(int)lVar12 + 1.0) / 6.0;
      fVar31 = (fVar31 + fVar31) * 3.1415927 + (float)local_78._0_4_;
      local_1e8._0_4_ = fVar31;
      iVar21 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1c8,(float)local_d8._0_4_,local_108,fVar31,local_88._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,IVar7,false,local_20c);
      (this->_Path).Size = 0;
      iVar24 = (this->VtxBuffer).Size;
      _local_1d8 = ZEXT416((uint)local_1c8.x);
      local_208._0_4_ = cosf(local_108);
      local_208._4_4_ = extraout_XMM0_Db_02;
      uStack_200._0_4_ = extraout_XMM0_Dc_02;
      uStack_200._4_4_ = extraout_XMM0_Dd_02;
      auVar29._4_4_ = local_1c8.y;
      auVar29._0_4_ = local_1d8._0_4_;
      auVar29._8_4_ = local_1d8._4_4_;
      auVar29._12_4_ = 0;
      _local_1d8 = auVar29;
      fVar31 = sinf(local_108);
      fVar20 = (float)local_208._4_4_ * fStack_c0;
      local_208._4_4_ = fVar31 * (float)local_c8._4_4_ + (float)local_1d8._4_4_;
      local_208._0_4_ = (float)local_208._0_4_ * (float)local_c8._0_4_ + (float)local_1d8._0_4_;
      uStack_200._0_4_ = (uint)(fVar20 + fStack_1d0);
      uStack_200._4_4_ = (uint)(extraout_XMM0_Db_03 * fStack_bc + fStack_1cc);
      _local_1d8 = ZEXT416((uint)local_1c8.x);
      local_108 = cosf((float)local_1e8._0_4_);
      auVar30._4_4_ = local_1c8.y;
      auVar30._0_4_ = local_1d8._0_4_;
      auVar30._8_4_ = local_1d8._4_4_;
      auVar30._12_4_ = 0;
      _local_1d8 = auVar30;
      fVar31 = sinf((float)local_1e8._0_4_);
      gradient_p1.x = local_108 * (float)local_c8._0_4_ + (float)local_1d8._0_4_;
      gradient_p1.y = fVar31 * (float)local_c8._4_4_ + (float)local_1d8._4_4_;
      lVar1 = lVar12 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar21,iVar24,(ImVec2)local_208,gradient_p1,(ImU32)(&local_168.x)[lVar12],
                 (ImU32)(&local_168.y)[lVar12]);
      lVar12 = lVar1;
    } while (lVar1 != 6);
    local_208._0_4_ = cosf((local_230 + local_230) * 3.1415927);
    local_208._4_4_ = extraout_XMM0_Db_04;
    uStack_200._0_4_ = extraout_XMM0_Dc_03;
    uStack_200._4_4_ = extraout_XMM0_Dd_03;
    local_1d8._0_4_ = sinf((local_230 + local_230) * 3.1415927);
    IVar9 = local_ec;
    IVar7 = local_1ec;
    local_1d8._4_4_ = extraout_XMM0_Db_05;
    fStack_1d0 = (float)extraout_XMM0_Dc_04;
    fStack_1cc = (float)extraout_XMM0_Dd_04;
    local_138._0_4_ = (float)local_208._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1c8.x;
    local_138._4_4_ = (float)local_1d8._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1c8.y;
    if ((char)local_214 == '\0') {
      fVar31 = 0.55;
    }
    else {
      fVar31 = 0.65;
    }
    local_20c = local_20c * fVar31;
    iVar21 = 0x20;
    if ((int)(local_20c / 1.4) < 0x20) {
      iVar21 = (int)(local_20c / 1.4);
    }
    iVar24 = 9;
    if (9 < iVar21) {
      iVar24 = iVar21;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_138,local_20c,local_ec,iVar24);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_20c + 1.0,local_1a0,iVar24,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_20c,IVar7,iVar24,1.0);
    local_f8.x = local_190.x * (float)local_208._0_4_ + -local_190.y * (float)local_1d8._0_4_ +
                 local_1c8.x;
    local_f8.y = local_190.x * (float)local_1d8._0_4_ + local_190.y * (float)local_208._0_4_ +
                 local_1c8.y;
    local_38.x = local_170.x * (float)local_208._0_4_ + -local_170.y * (float)local_1d8._0_4_ +
                 local_1c8.x;
    local_38.y = local_170.x * (float)local_1d8._0_4_ + local_170.y * (float)local_208._0_4_ +
                 local_1c8.y;
    local_40.x = local_198.x * (float)local_208._0_4_ + -local_198.y * (float)local_1d8._0_4_ +
                 local_1c8.x;
    local_40.y = local_198.x * (float)local_1d8._0_4_ + local_198.y * (float)local_208._0_4_ +
                 local_1c8.y;
    IVar22 = GetFontTexUvWhitePixel();
    uStack_200 = extraout_XMM0_Qb;
    local_208._0_4_ = IVar22.x;
    local_208._4_4_ = IVar22.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar36 = _local_208;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = this->_VtxCurrentIdx;
    this->_IdxWritePtr = puVar3 + 1;
    this->_VtxWritePtr->pos = local_f8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar9;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = uVar15;
    this->_IdxWritePtr = puVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar9;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = uVar15;
    this->_IdxWritePtr = puVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar7;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = uVar15;
    this->_IdxWritePtr = puVar3 + 1;
    pIVar4[1].pos = local_f8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = uVar15;
    this->_IdxWritePtr = puVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = (ImU32)local_b0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    puVar3 = this->_IdxWritePtr;
    *puVar3 = uVar15;
    this->_IdxWritePtr = puVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_208._0_4_;
    (pIVar4->uv).y = (float)local_208._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_208 = auVar36;
    ImDrawList::AddTriangle(this,&local_f8,&local_38,&local_40,local_1a0,1.5);
    fVar31 = 1.0;
    if (local_22c <= 1.0) {
      fVar31 = local_22c;
    }
    fVar31 = (float)(~-(uint)(local_22c < 0.0) & (uint)fVar31);
    fVar27 = 1.0 - local_228;
    fVar20 = 1.0;
    if (fVar27 <= 1.0) {
      fVar20 = fVar27;
    }
    fVar20 = (float)(~-(uint)(fVar27 < 0.0) & (uint)fVar20);
    fVar27 = fVar31 * (local_f8.x - local_40.x) + local_40.x;
    fVar31 = fVar31 * (local_f8.y - local_40.y) + local_40.y;
    local_110.x = fVar20 * (local_38.x - fVar27) + fVar27;
    local_110.y = fVar20 * (local_38.y - fVar31) + fVar31;
    pIVar14 = local_1b0;
    uVar19 = local_224;
    IVar9 = local_1a4;
  }
  pIVar5 = local_220;
  if ((char)local_210 == '\0') {
    fVar31 = 6.0;
  }
  else {
    fVar31 = 10.0;
  }
  local_208._0_4_ = fVar31;
  ImDrawList::AddCircleFilled(this,&local_110,fVar31,IVar9,0xc);
  ImDrawList::AddCircle(this,&local_110,(float)local_208._0_4_ + 1.0,local_1a0,0xc,1.0);
  ImDrawList::AddCircle(this,&local_110,(float)local_208._0_4_,local_1ec,0xc,1.0);
  if (local_19c == 0x10000) {
    fVar31 = pIVar14[1].y;
    _local_1d8 = ZEXT416((uint)fVar31);
    fVar20 = 1.0;
    if (fVar31 <= 1.0) {
      fVar20 = fVar31;
    }
    _local_208 = ZEXT416((uint)(1.0 - fVar20));
    local_138._4_4_ = local_1f8.y;
    local_138._0_4_ = local_128._0_4_;
    local_130.x = (float)local_128._0_4_ + local_148;
    local_130.y = local_1f8.y + local_188;
    RenderColorRectWithAlphaCheckerboard
              (this,(ImVec2)local_138,local_130,0,(local_130.x - (float)local_128._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_138,&local_130,IVar9,IVar9,IVar9 & 0xffffff,IVar9 & 0xffffff);
    local_208._4_4_ = (float)(int)(float)(~local_1d8._4_4_ & local_208._4_4_);
    local_208._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1d8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1d8._0_4_ < 0.0) & local_208._0_4_) * local_188 +
                      local_1f8.y + 0.5);
    uStack_200._0_4_ = (uint)(float)(int)(float)(~(uint)fStack_1d0 & (uint)uStack_200);
    uStack_200._4_4_ = (uint)(float)(int)(float)(~(uint)fStack_1cc & uStack_200._4_4_);
    RenderFrameBorder((ImVec2)local_138,local_130,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_208._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_148 + 2.0,(pIVar5->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar19 != '\0') {
    iVar21 = bcmp(local_58,pIVar14,local_b8);
    uVar19 = uVar19 & 0xff;
    if (iVar21 == 0) {
      uVar19 = 0;
    }
  }
  bVar16 = (byte)uVar19;
  if ((uVar19 & 1) != 0) {
    MarkItemEdited((local_118->DC).LastItemId);
  }
  PopID();
LAB_0016b507:
  return (bool)(bVar16 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
        {
            if (S == 0)
                H = g.ColorEditLastHue;
            if (V == 0)
                S = g.ColorEditLastSat;
        }
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
            {
                if (S == 0)
                    H = g.ColorEditLastHue;
                if (V == 0)
                    S = g.ColorEditLastSat;
            }
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}